

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry_p.h
# Opt level: O3

void __thiscall QFileSystemEntry::clear(QFileSystemEntry *this)

{
  qsizetype qVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QFileSystemEntry local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry(&local_58);
  pQVar4 = &((this->m_filePath).d.d)->super_QArrayData;
  pcVar5 = (this->m_filePath).d.ptr;
  (this->m_filePath).d.d = local_58.m_filePath.d.d;
  (this->m_filePath).d.ptr = local_58.m_filePath.d.ptr;
  qVar1 = (this->m_filePath).d.size;
  (this->m_filePath).d.size = local_58.m_filePath.d.size;
  data = &((this->m_nativeFilePath).d.d)->super_QArrayData;
  pcVar2 = (this->m_nativeFilePath).d.ptr;
  (this->m_nativeFilePath).d.d = local_58.m_nativeFilePath.d.d;
  (this->m_nativeFilePath).d.ptr = local_58.m_nativeFilePath.d.ptr;
  qVar3 = (this->m_nativeFilePath).d.size;
  (this->m_nativeFilePath).d.size = local_58.m_nativeFilePath.d.size;
  this->m_lastDotInFileName = local_58.m_lastDotInFileName;
  this->m_lastSeparator = local_58.m_lastSeparator;
  this->m_firstDotInFileName = local_58.m_firstDotInFileName;
  local_58.m_filePath.d.d = (Data *)pQVar4;
  local_58.m_filePath.d.ptr = pcVar5;
  local_58.m_filePath.d.size = qVar1;
  local_58.m_nativeFilePath.d.d = (Data *)data;
  local_58.m_nativeFilePath.d.ptr = pcVar2;
  local_58.m_nativeFilePath.d.size = qVar3;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  if (&(local_58.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_58.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear()
    {
        *this = QFileSystemEntry();
    }